

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

ostream * __thiscall
parser::GrammaticSymbol::stringify
          (GrammaticSymbol *this,ostream *out,TerminalNames *terminalNames,
          NonTerminalNames *nonTerminalNames)

{
  ostream *poVar1;
  char *pcVar2;
  string local_40;
  
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0xe;
  pcVar2 = "NonTerminal";
  if ((ulong)this->isTerminal != 0) {
    pcVar2 = "Terminal";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,pcVar2,((ulong)this->isTerminal ^ 1) * 3 + 8);
  std::__ostream_insert<char,std::char_traits<char>>(out,": ",2);
  if (this->isTerminal == true) {
    lexer::terminalName(&local_40,this->value,terminalNames);
  }
  else {
    nonTerminalName(&local_40,this->value,nonTerminalNames);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

std::ostream& stringify(std::ostream& out, lexer::TerminalNames const& terminalNames, NonTerminalNames const& nonTerminalNames) const {
            return out << std::setw(14)
                         << (isTerminal ? "Terminal" : "NonTerminal") << ": "
                         << (isTerminal ? lexer::terminalName(value, terminalNames) : nonTerminalName(value, nonTerminalNames));
        }